

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

Status __thiscall
google::protobuf::(anonymous_namespace)::Error<char_const*,google::protobuf::Edition,char_const*>
          (_anonymous_namespace_ *this,char *args,Edition args_1,char *args_2)

{
  AlphaNum *in_R8;
  string_view message;
  Edition local_ec;
  string local_e8;
  StringifySink local_c8;
  string_view local_a8 [3];
  AlphaNum local_78;
  AlphaNum local_48;
  
  local_ec = args_1;
  local_a8[0] = absl::lts_20250127::NullSafeStringView(args);
  local_c8.buffer_._M_dataplus._M_p = (pointer)&local_c8.buffer_.field_2;
  local_c8.buffer_.field_2._M_allocated_capacity = 0;
  local_c8.buffer_.field_2._8_8_ = 0;
  local_c8.buffer_._M_string_length = 0;
  local_48.piece_ =
       absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                 (&local_c8,&local_ec);
  local_78.piece_ = absl::lts_20250127::NullSafeStringView(args_2);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_e8,(lts_20250127 *)local_a8,&local_48,&local_78,in_R8);
  message._M_str = (char *)local_e8._M_string_length;
  message._M_len = (size_t)this;
  absl::lts_20250127::FailedPreconditionError(message);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}